

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config.cc
# Opt level: O2

int ClientCertCallback(SSL *ssl,X509 **out_x509,EVP_PKEY **out_pkey)

{
  UniquePtr<EVP_PKEY> UVar1;
  UniquePtr<X509> UVar2;
  bool bVar3;
  pointer __p;
  TestConfig *pTVar4;
  TestState *pTVar5;
  int iVar6;
  UniquePtr<EVP_PKEY> pkey;
  UniquePtr<X509> x509;
  UniquePtr<struct_stack_st_X509> chain;
  
  bVar3 = CheckCertificateRequest(ssl);
  iVar6 = -1;
  if ((bVar3) &&
     ((pTVar4 = GetTestConfig(ssl), pTVar4->async != true ||
      (pTVar5 = GetTestState(ssl), pTVar5->cert_ready == true)))) {
    x509._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_x509_st_*,_false>._M_head_impl =
         (__uniq_ptr_data<x509_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0;
    chain._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl =
         (__uniq_ptr_data<stack_st_X509,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>)0x0;
    pkey._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl =
         (__uniq_ptr_data<evp_pkey_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>)0x0;
    bVar3 = GetCertificate(ssl,&x509,&chain,&pkey);
    UVar2 = x509;
    UVar1 = pkey;
    if (bVar3) {
      if ((__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
          x509._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_x509_st_*,_false>._M_head_impl ==
          (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0) {
        iVar6 = 0;
      }
      else {
        x509._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_x509_st_*,_false>._M_head_impl =
             (__uniq_ptr_data<x509_st,_bssl::internal::Deleter,_true,_true>)
             (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0;
        *out_x509 = (X509 *)UVar2._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
        pkey._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl =
             (__uniq_ptr_data<evp_pkey_st,_bssl::internal::Deleter,_true,_true>)
             (__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>)0x0;
        *out_pkey = (EVP_PKEY *)
                    UVar1._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl;
        iVar6 = 1;
      }
    }
    else {
      iVar6 = -1;
    }
    std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr(&pkey);
    std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::~unique_ptr(&chain);
    std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&x509);
  }
  return iVar6;
}

Assistant:

static int ClientCertCallback(SSL *ssl, X509 **out_x509, EVP_PKEY **out_pkey) {
  if (!CheckCertificateRequest(ssl)) {
    return -1;
  }

  if (GetTestConfig(ssl)->async && !GetTestState(ssl)->cert_ready) {
    return -1;
  }

  bssl::UniquePtr<X509> x509;
  bssl::UniquePtr<STACK_OF(X509)> chain;
  bssl::UniquePtr<EVP_PKEY> pkey;
  if (!GetCertificate(ssl, &x509, &chain, &pkey)) {
    return -1;
  }

  // Return zero for no certificate.
  if (!x509) {
    return 0;
  }

  // Chains and asynchronous private keys are not supported with client_cert_cb.
  *out_x509 = x509.release();
  *out_pkey = pkey.release();
  return 1;
}